

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void touchvar(char *name)

{
  ident *piVar1;
  char *local_8;
  
  piVar1 = hashset<ident>::access<char_const*>(&idents,&local_8);
  if (((piVar1 != (ident *)0x0) && ((uint)piVar1->type < 3)) && (piVar1->fun != (identfun)0x0)) {
    (*piVar1->fun)();
  }
  return;
}

Assistant:

void touchvar(const char *name)
{
    ident *id = idents.access(name);
    if(id) switch(id->type)
    {
        case ID_VAR:
        case ID_FVAR:
        case ID_SVAR:
            id->changed();
            break;
    }
}